

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::extract_struct_info_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  pointer *__return_storage_ptr___01;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  uint uVar2;
  undefined8 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 this_00;
  uint uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_198 [8];
  PortPackedVisitor visitor;
  vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> structs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  undefined1 local_80 [8];
  string entry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  allocator_type local_31;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_198 = (undefined1  [8])&PTR_visit_root_002ac1e8;
  visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&visitor.structs_;
  visitor.structs_._M_t._M_impl._0_4_ = 0;
  visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&visitor.struct_ports_;
  visitor.struct_ports_._M_t._M_impl._0_4_ = 0;
  visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  IRVisitor::visit_generator_root((IRVisitor *)local_198,(Generator *)this);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  PortPackedVisitor::structs
            ((vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> *)
             &visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PortPackedVisitor *)local_198);
  uVar5 = 0;
  __return_storage_ptr___01 =
       &structs.
        super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  end._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (&name.field_2._M_allocated_capacity + 1);
  while( true ) {
    uVar6 = (ulong)uVar5;
    if ((ulong)((long)((long)structs.
                             super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                             ._M_impl.super__Vector_impl_data._M_start -
                      visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_node_count) >> 3)
        <= uVar6) break;
    puVar3 = *(undefined8 **)
              (visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_node_count + uVar6 * 8);
    local_80 = (undefined1  [8])&entry._M_string_length;
    entry._M_dataplus._M_p = (pointer)0x0;
    entry._M_string_length._0_1_ = 0;
    std::__cxx11::string::append(local_80);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar3[5];
    for (__args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar3[4];
        __args != pbVar4;
        __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &__args[1].field_2) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __args[1]._M_string_length ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr___01,"    logic",(allocator<char> *)end._M_current
                  );
        __l._M_len = 1;
        __l._M_array = (iterator)__return_storage_ptr___01;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&entry.field_2 + 8),__l,&local_31);
        std::__cxx11::string::~string((string *)__return_storage_ptr___01);
        uVar2 = *(uint *)&__args[1]._M_dataplus._M_p;
        if (1 < uVar2) {
          name.field_2._8_8_ = ZEXT48(uVar2 - 1);
          bVar7 = fmt::v7::to_string_view<char,_0>("[{0}:0]");
          format_str.data_ = (char *)bVar7.size_;
          format_str.size_ = 2;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)end._M_current;
          in_R8._M_current = end._M_current;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)__return_storage_ptr___01,(detail *)bVar7.data_,format_str,args);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (entry.field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr___01);
          std::__cxx11::string::~string((string *)__return_storage_ptr___01);
        }
        if (*(char *)((long)&__args[1]._M_dataplus._M_p + 4) == '\x01') {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[7]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (entry.field_2._M_local_buf + 8),(char (*) [7])0x21a5af);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (entry.field_2._M_local_buf + 8),__args);
        this_00 = entry.field_2._8_8_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)end._M_current," ",(allocator<char> *)&local_31);
        string::
        join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((string *)__return_storage_ptr___01,(string *)this_00,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )str.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,end,in_R8._M_current);
        std::__cxx11::string::~string((string *)end._M_current);
        std::operator+(end._M_current,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr___01,";\n");
        std::__cxx11::string::append((string *)local_80);
        std::__cxx11::string::~string((string *)end._M_current);
        std::__cxx11::string::~string((string *)__return_storage_ptr___01);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&entry.field_2 + 8));
      }
      else {
        __return_storage_ptr___00 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&entry.field_2 + 8);
        std::operator+(__return_storage_ptr___00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __args[1]._M_string_length," ");
        std::operator+(end._M_current,__return_storage_ptr___00,__args);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr___01,end._M_current,";\n");
        std::__cxx11::string::append((string *)local_80);
        std::__cxx11::string::~string((string *)__return_storage_ptr___01);
        std::__cxx11::string::~string((string *)end._M_current);
        std::__cxx11::string::~string((string *)(entry.field_2._M_local_buf + 8));
      }
    }
    name.field_2._8_8_ = *puVar3;
    bVar7 = fmt::v7::to_string_view<char,_0>("}} {0};\n");
    format_str_00.data_ = (char *)bVar7.size_;
    format_str_00.size_ = 0xd;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)end._M_current;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)__return_storage_ptr___01,(detail *)bVar7.data_,format_str_00,args_00);
    std::__cxx11::string::append((string *)local_80);
    std::__cxx11::string::~string((string *)__return_storage_ptr___01);
    name.field_2._8_8_ = uVar6;
    bVar7 = fmt::v7::to_string_view<char,_0>("{0:032d}");
    format_str_01.data_ = (char *)bVar7.size_;
    format_str_01.size_ = 2;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)end._M_current;
    in_R8._M_current = end._M_current;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)__return_storage_ptr___01,(detail *)bVar7.data_,format_str_01,args_01);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::__cxx11::string&,std::__cxx11::string&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr___01,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    std::__cxx11::string::~string((string *)__return_storage_ptr___01);
    std::__cxx11::string::~string((string *)local_80);
    uVar5 = uVar5 + 1;
  }
  std::_Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>::
  ~_Vector_base((_Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                 *)&visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  PortPackedVisitor::~PortPackedVisitor((PortPackedVisitor *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> extract_struct_info(Generator* top) {
    PortPackedVisitor visitor;
    visitor.visit_generator_root(top);

    // convert the definition into
    std::map<std::string, std::string> result;
    auto const structs = visitor.structs();
    for (uint32_t i = 0; i < structs.size(); i++) {
        auto const* struct_ = structs[i];
        // TODO:
        //  Use Stream class in the codegen instead to track the debugging info
        //  Share the same code gen logic with Stream
        std::string entry;
        entry.append("typedef struct packed {\n");

        for (auto const& def : struct_->attributes) {
            if (!def.struct_) {
                std::vector<std::string> str = {"    logic"};
                if (def.width > 1) str.emplace_back(::format("[{0}:0]", def.width - 1));
                if (def.signed_) str.emplace_back("signed");
                str.emplace_back(def.name);
                auto entry_str = string::join(str.begin(), str.end(), " ");
                entry.append(entry_str + ";\n");
            } else {
                entry.append(def.struct_->struct_name + " " + def.name + ";\n");
            }
        }
        entry.append(::format("}} {0};\n", struct_->struct_name));
        // this is a hack to ensure ordering. refactoring this requires refactoring
        // code from the caller site
        auto name = fmt::format("{0:032d}", i);
        result.emplace(name, entry);
    }
    return result;
}